

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

bool fm_processModelLine(char *fileName,int ln,string *text,FlightModel *fm)

{
  bool bVar1;
  int iVar2;
  logLevelTy lVar3;
  size_type sVar4;
  size_type sVar5;
  undefined8 uVar6;
  char *pcVar7;
  ulong uVar8;
  double *pdVar9;
  long in_RCX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  double dVar10;
  double dec;
  double divisor;
  string decimals;
  double val;
  string name;
  smatch m;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  match_flag_type in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  allocator<char> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0c;
  undefined1 in_stack_fffffffffffffd0d;
  undefined1 in_stack_fffffffffffffd0e;
  undefined1 in_stack_fffffffffffffd0f;
  undefined1 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd11;
  undefined1 in_stack_fffffffffffffd12;
  undefined1 in_stack_fffffffffffffd13;
  undefined1 in_stack_fffffffffffffd14;
  undefined1 in_stack_fffffffffffffd15;
  undefined1 in_stack_fffffffffffffd16;
  undefined1 in_stack_fffffffffffffd17;
  undefined8 in_stack_fffffffffffffd38;
  undefined1 bSkipEmpty;
  undefined6 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  string *in_stack_fffffffffffffd48;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  __type_conflict local_178;
  string local_170 [32];
  string local_150 [39];
  byte local_129;
  string local_128 [32];
  string local_108 [32];
  double local_e8;
  string local_e0 [64];
  undefined4 local_a0;
  allocator<char> local_99;
  string local_98 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  allocator<char> local_49;
  string local_48 [32];
  long local_28;
  undefined4 local_14;
  undefined8 local_10;
  byte local_1;
  
  bSkipEmpty = (undefined1)((ulong)in_stack_fffffffffffffd38 >> 0x38);
  local_28 = in_RCX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd17,
                      CONCAT16(in_stack_fffffffffffffd16,
                               CONCAT15(in_stack_fffffffffffffd15,
                                        CONCAT14(in_stack_fffffffffffffd14,
                                                 CONCAT13(in_stack_fffffffffffffd13,
                                                          CONCAT12(in_stack_fffffffffffffd12,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffd11,
                                                  in_stack_fffffffffffffd10))))))),
             (char *)CONCAT17(in_stack_fffffffffffffd0f,
                              CONCAT16(in_stack_fffffffffffffd0e,
                                       CONCAT15(in_stack_fffffffffffffd0d,
                                                CONCAT14(in_stack_fffffffffffffd0c,
                                                         in_stack_fffffffffffffd08)))),
             in_stack_fffffffffffffd00);
  bVar1 = begins_with<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     in_stack_fffffffffffffce8);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd17,
                        CONCAT16(in_stack_fffffffffffffd16,
                                 CONCAT15(in_stack_fffffffffffffd15,
                                          CONCAT14(in_stack_fffffffffffffd14,
                                                   CONCAT13(in_stack_fffffffffffffd13,
                                                            CONCAT12(in_stack_fffffffffffffd12,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffd11,
                                                  in_stack_fffffffffffffd10))))))),
               (char *)CONCAT17(in_stack_fffffffffffffd0f,
                                CONCAT16(in_stack_fffffffffffffd0e,
                                         CONCAT15(in_stack_fffffffffffffd0d,
                                                  CONCAT14(in_stack_fffffffffffffd0c,
                                                           in_stack_fffffffffffffd08)))),
               in_stack_fffffffffffffd00);
    str_tokenize(in_stack_fffffffffffffd48,
                 (string *)
                 CONCAT17(in_stack_fffffffffffffd47,
                          CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
                 (bool)bSkipEmpty);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_78);
    if (sVar4 == 2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_78,1);
      iVar2 = std::__cxx11::stoi(in_stack_fffffffffffffcd0,
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),0);
      conv_color(iVar2,(float *)(local_28 + 0x130));
      local_1 = 1;
    }
    else {
      lVar3 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar3 < 3) {
        uVar6 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
               ,0x31b,"fm_processModelLine",logWARN,"Format mismatch in \'%s\', line %d: %s",
               local_10,local_14,uVar6);
      }
      local_1 = 0;
    }
    local_a0 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    goto LAB_0018fcd1;
  }
  if ((fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)::
       re_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)
                                   ::re_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffd17,
                        CONCAT16(in_stack_fffffffffffffd16,
                                 CONCAT15(in_stack_fffffffffffffd15,
                                          CONCAT14(in_stack_fffffffffffffd14,
                                                   CONCAT13(in_stack_fffffffffffffd13,
                                                            CONCAT12(in_stack_fffffffffffffd12,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffd11,
                                                  in_stack_fffffffffffffd10))))))),
               (char *)CONCAT17(in_stack_fffffffffffffd0f,
                                CONCAT16(in_stack_fffffffffffffd0e,
                                         CONCAT15(in_stack_fffffffffffffd0d,
                                                  CONCAT14(in_stack_fffffffffffffd0c,
                                                           in_stack_fffffffffffffd08)))),
               (flag_type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)
                  ::re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)
                         ::re_abi_cxx11_);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffcd0);
  std::
  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)in_stack_fffffffffffffce8,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),in_stack_fffffffffffffcdc
            );
  sVar5 = std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffcd0);
  if ((sVar5 < 3) ||
     (sVar5 = std::__cxx11::
              match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffcd0), 4 < sVar5)) {
    lVar3 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar3 < 3) {
      uVar6 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
             ,0x32a,"fm_processModelLine",logWARN,"Format mismatch in \'%s\', line %d: %s",local_10,
             local_14,uVar6);
    }
    local_1 = 0;
    local_a0 = 1;
  }
  else {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::__cxx11::sub_match::operator_cast_to_string
              ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                 CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffd0f,
                      CONCAT16(in_stack_fffffffffffffd0e,
                               CONCAT15(in_stack_fffffffffffffd0d,
                                        CONCAT14(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08
                                                )))));
    pcVar7 = (char *)std::__cxx11::string::c_str();
    dVar10 = atof(pcVar7);
    std::__cxx11::string::~string(local_108);
    local_e8 = dVar10;
    sVar5 = std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_fffffffffffffcd0);
    local_129 = 0;
    bVar1 = false;
    if (sVar5 == 4) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      std::__cxx11::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffd0f,
                        CONCAT16(in_stack_fffffffffffffd0e,
                                 CONCAT15(in_stack_fffffffffffffd0d,
                                          CONCAT14(in_stack_fffffffffffffd0c,
                                                   in_stack_fffffffffffffd08)))));
      local_129 = 1;
      uVar8 = std::__cxx11::string::size();
      bVar1 = 1 < uVar8;
    }
    if ((local_129 & 1) != 0) {
      std::__cxx11::string::~string(local_128);
    }
    if (bVar1) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      std::__cxx11::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffd0f,
                        CONCAT16(in_stack_fffffffffffffd0e,
                                 CONCAT15(in_stack_fffffffffffffd0d,
                                          CONCAT14(in_stack_fffffffffffffd0c,
                                                   in_stack_fffffffffffffd08)))));
      std::__cxx11::string::substr((ulong)local_150,(ulong)local_170);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::length();
      local_178 = std::pow<int,unsigned_long>
                            ((int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      pcVar7 = (char *)std::__cxx11::string::c_str();
      local_180 = atof(pcVar7);
      local_180 = local_180 / local_178;
      local_e8 = local_180 + local_e8;
      std::__cxx11::string::~string(local_150);
    }
    if ((local_e8 < -10000.0) || (60000.0 < local_e8)) {
      lVar3 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar3 < 3) {
        uVar6 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
               ,0x33f,"fm_processModelLine",logWARN,"Value invalid in \'%s\', line %d: %s",local_10,
               local_14,uVar6);
      }
      local_1 = 0;
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                              (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
      ;
      if (bVar1) {
        local_188 = 1.0;
        pdVar9 = std::max<double>(&local_e8,&local_188);
        *(double *)(local_28 + 0x20) = *pdVar9;
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                (char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8
                                                ));
        if (bVar1) {
          local_190 = 0.1;
          pdVar9 = std::max<double>(&local_e8,&local_190);
          *(double *)(local_28 + 0x28) = *pdVar9;
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                   in_stack_fffffffffffffcc8));
          if (bVar1) {
            local_198 = 1.0;
            pdVar9 = std::max<double>(&local_e8,&local_198);
            *(double *)(local_28 + 0x30) = *pdVar9;
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                    (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                     in_stack_fffffffffffffcc8));
            if (bVar1) {
              *(double *)(local_28 + 0x38) = local_e8;
            }
            else {
              bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                      (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                       in_stack_fffffffffffffcc8));
              if (bVar1) {
                *(double *)(local_28 + 0x40) = local_e8;
              }
              else {
                bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                        (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                         in_stack_fffffffffffffcc8));
                if (bVar1) {
                  *(double *)(local_28 + 0x48) = local_e8;
                }
                else {
                  bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                          (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                           in_stack_fffffffffffffcc8));
                  if (bVar1) {
                    *(double *)(local_28 + 0x50) = local_e8;
                  }
                  else {
                    bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                            (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                             in_stack_fffffffffffffcc8));
                    if (bVar1) {
                      *(double *)(local_28 + 0x58) = local_e8;
                    }
                    else {
                      bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                              (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                               in_stack_fffffffffffffcc8));
                      if (bVar1) {
                        *(double *)(local_28 + 0x60) = local_e8;
                      }
                      else {
                        bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                 in_stack_fffffffffffffcc8));
                        if (bVar1) {
                          *(double *)(local_28 + 0x68) = local_e8;
                        }
                        else {
                          bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                          if (bVar1) {
                            *(double *)(local_28 + 0x70) = local_e8;
                          }
                          else {
                            bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                    (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                     in_stack_fffffffffffffcc8));
                            if (bVar1) {
                              *(double *)(local_28 + 0x78) = local_e8;
                            }
                            else {
                              bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                      (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                       in_stack_fffffffffffffcc8));
                              if (bVar1) {
                                *(double *)(local_28 + 0x80) = local_e8;
                              }
                              else {
                                bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                        (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                         in_stack_fffffffffffffcc8))
                                ;
                                if (bVar1) {
                                  *(double *)(local_28 + 0x88) = local_e8;
                                }
                                else {
                                  bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                          (char *)CONCAT44(in_stack_fffffffffffffccc
                                                                           ,
                                                  in_stack_fffffffffffffcc8));
                                  if (bVar1) {
                                    local_1a0 = 1.0;
                                    pdVar9 = std::max<double>(&local_e8,&local_1a0);
                                    *(double *)(local_28 + 0x90) = *pdVar9;
                                  }
                                  else {
                                    bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                            (char *)CONCAT44(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8));
                                    if (bVar1) {
                                      *(double *)(local_28 + 0x98) = local_e8;
                                    }
                                    else {
                                      bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                              (char *)CONCAT44(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8));
                                      if (bVar1) {
                                        local_1a8 = 1.0;
                                        pdVar9 = std::max<double>(&local_e8,&local_1a8);
                                        *(double *)(local_28 + 0xa0) = *pdVar9;
                                      }
                                      else {
                                        bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                                (char *)CONCAT44(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8));
                                        if (bVar1) {
                                          local_1b0 = 1.0;
                                          pdVar9 = std::max<double>(&local_e8,&local_1b0);
                                          *(double *)(local_28 + 0xa8) = *pdVar9;
                                        }
                                        else {
                                          bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                                  (char *)CONCAT44(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8));
                                          if (bVar1) {
                                            local_1b8 = 1.0;
                                            pdVar9 = std::max<double>(&local_e8,&local_1b8);
                                            *(double *)(local_28 + 0xb0) = *pdVar9;
                                          }
                                          else {
                                            bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                                    (char *)CONCAT44(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8));
                                            if (bVar1) {
                                              *(double *)(local_28 + 0xb8) = local_e8;
                                            }
                                            else {
                                              bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                                      (char *)CONCAT44(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8));
                                              if (bVar1) {
                                                *(double *)(local_28 + 0xc0) = local_e8;
                                              }
                                              else {
                                                bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                                        (char *)CONCAT44(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8));
                                                if (bVar1) {
                                                  *(double *)(local_28 + 200) = local_e8;
                                                }
                                                else {
                                                  bVar1 = std::operator==(in_stack_fffffffffffffcd0,
                                                                          (char *)CONCAT44(
                                                  in_stack_fffffffffffffccc,
                                                  in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0xd0) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0xd8) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0xe0) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0xe8) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0xf0) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0xf8) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0x100) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0x108) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0x110) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    local_1c0 = 1.0;
                                                    pdVar9 = std::max<double>(&local_e8,&local_1c0);
                                                    *(double *)(local_28 + 0x118) = *pdVar9;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0x120) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0x128) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0x140) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (bVar1) {
                                                    *(double *)(local_28 + 0x148) = local_e8;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(
                                                  in_stack_fffffffffffffcd0,
                                                  (char *)CONCAT44(in_stack_fffffffffffffccc,
                                                                   in_stack_fffffffffffffcc8));
                                                  if (!bVar1) {
                                                    lVar3 = DataRefs::GetLogLevel(&dataRefs);
                                                    if ((int)lVar3 < 3) {
                                                      uVar6 = std::__cxx11::string::c_str();
                                                      LogMsg(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
                                                  ,0x36d,"fm_processModelLine",logWARN,
                                                  "Unknown parameter in \'%s\', line %d: %s",
                                                  local_10,local_14,uVar6);
                                                  }
                                                  local_1 = 0;
                                                  goto LAB_0018fc95;
                                                  }
                                                  *(double *)(local_28 + 0x150) = local_e8;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_1 = 1;
    }
LAB_0018fc95:
    local_a0 = 1;
    std::__cxx11::string::~string(local_e0);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x18fcc0);
LAB_0018fcd1:
  return (bool)(local_1 & 1);
}

Assistant:

bool fm_processModelLine (const char* fileName, int ln,
                          std::string& text, LTAircraft::FlightModel& fm)
{
    // There is one special case: LABEL_COLOR
    if (begins_with<std::string>(text, MDL_LABEL_COLOR))
    {
        // separate LABEL_COLOR from actual value
        const std::vector<std::string> t = str_tokenize(text, " ");
        if (t.size() != 2) {
            LOG_MSG(logWARN, ERR_CFG_FORMAT, fileName, ln, text.c_str());
            return false;
        }
        // convert the value first from hex to a number, then to a float array
        conv_color(std::stoi(t[1], nullptr, 16), fm.LABEL_COLOR);
        return true;
    }
    
    // split into name and value (keeping integer and digits separate to avoid different decimal interpretation later on)
    static std::regex re ("(\\w+)\\s+(-?\\d+)(\\.\\d+)?");
    std::smatch m;
    std::regex_search(text, m, re);
    
    // two or three matches expected
    if (m.size() < 3 || m.size() > 4) {
        LOG_MSG(logWARN, ERR_CFG_FORMAT, fileName, ln, text.c_str());
        return false;
    }
    
    // name and value
    std::string name (m[1]);
    double val = std::atof(m[2].str().c_str());
    
    // Are there some decimal places given?
    // (This handling makes us independend of atof() interpreting any localized decimal point.
    //  See https://github.com/TwinFan/LiveTraffic/issues/156 )
    if (m.size() == 4 && m[3].str().size() >= 2) {
        // copy everything after the dot
        std::string decimals = m[3].str().substr(1);
        const double divisor = std::pow(10, decimals.length());
        const double dec = std::atof(decimals.c_str()) / divisor;
        val += dec;
    }
    
    // some very very basic bounds checking
    if (val < -10000 || val > 60000) {
        LOG_MSG(logWARN, ERR_CFG_VAL_INVALID, fileName, ln, text.c_str());
        return false;
    }
                           
    // now find correct member variable and assign value
#define FM_ASSIGN(nameOfVal) if (name == #nameOfVal) fm.nameOfVal = val
#define FM_ASSIGN_MIN(nameOfVal,minVal) if (name == #nameOfVal) fm.nameOfVal = std::max(val,minVal)

    FM_ASSIGN_MIN(GEAR_DURATION,1.0);       // avoid zero - this is a moving parameter
    else FM_ASSIGN_MIN(GEAR_DEFLECTION,0.1);// avoid zero - this is a moving parameter
    else FM_ASSIGN_MIN(FLAPS_DURATION,1.0); // avoid zero - this is a moving parameter
    else FM_ASSIGN(VSI_STABLE);
    else FM_ASSIGN(ROTATE_TIME);
    else FM_ASSIGN(VSI_FINAL);
    else FM_ASSIGN(VSI_INIT_CLIMB);
    else FM_ASSIGN(SPEED_INIT_CLIMB);
    else FM_ASSIGN(VSI_MAX);
    else FM_ASSIGN(AGL_GEAR_DOWN);
    else FM_ASSIGN(AGL_GEAR_UP);
    else FM_ASSIGN(AGL_FLARE);
    else FM_ASSIGN(MAX_TAXI_SPEED);
    else FM_ASSIGN(MIN_REVERS_SPEED);
    else FM_ASSIGN_MIN(TAXI_TURN_TIME,1.0); // avoid zero - this becomes a divisor
    else FM_ASSIGN(FLIGHT_TURN_TIME);
    else FM_ASSIGN_MIN(MIN_FLIGHT_TURN_TIME,1.0); // avoid zero - this becomes a divisor
    else FM_ASSIGN_MIN(ROLL_MAX_BANK,1.0);  // avoid zero - this is a moving parameter
    else FM_ASSIGN_MIN(ROLL_RATE, 1.0);     // avoid zero - this becomes a divisor
    else FM_ASSIGN(MIN_FLIGHT_SPEED);
    else FM_ASSIGN(FLAPS_UP_SPEED);
    else FM_ASSIGN(FLAPS_DOWN_SPEED);
    else FM_ASSIGN(MAX_FLIGHT_SPEED);
    else FM_ASSIGN(CRUISE_HEIGHT);
    else FM_ASSIGN(ROLL_OUT_DECEL);
    else FM_ASSIGN(PITCH_MIN);
    else FM_ASSIGN(PITCH_MIN_VSI);
    else FM_ASSIGN(PITCH_MAX);
    else FM_ASSIGN(PITCH_MAX_VSI);
    else FM_ASSIGN(PITCH_FLAP_ADD);
    else FM_ASSIGN(PITCH_FLARE);
    else FM_ASSIGN_MIN(PITCH_RATE, 1.0);    // avoid zero - this becomes a divisor
    else FM_ASSIGN(PROP_RPM_MAX);
    else FM_ASSIGN(LIGHT_LL_ALT);
    else FM_ASSIGN(EXT_CAMERA_LON_OFS);
    else FM_ASSIGN(EXT_CAMERA_LAT_OFS);
    else FM_ASSIGN(EXT_CAMERA_VERT_OFS);
    else {
        LOG_MSG(logWARN, ERR_FM_UNKNOWN_NAME, fileName, ln, text.c_str());
        return false;
    }